

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureSpecificationTests.cpp
# Opt level: O1

void __thiscall
deqp::gles3::Functional::TexImage2DAlignCase::createTexture(TexImage2DAlignCase *this)

{
  ContextWrapper *this_00;
  TextureFormat *this_01;
  int i;
  int iVar1;
  long lVar2;
  int level;
  uint cellSize;
  uint width;
  uint height;
  uint rowPitch;
  deUint32 tex;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  float local_a8 [4];
  Vec4 colorB;
  float local_78 [4];
  Vec4 colorA;
  Vector<float,_4> res_1;
  
  tex = 0;
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = &(this->super_Texture2DSpecCase).super_TextureSpecCase.super_ContextWrapper;
  sglr::ContextWrapper::glGenTextures(this_00,1,&tex);
  sglr::ContextWrapper::glBindTexture(this_00,0xde1,tex);
  sglr::ContextWrapper::glPixelStorei(this_00,0xcf5,this->m_alignment);
  if (0 < (this->super_Texture2DSpecCase).m_numLevels) {
    this_01 = &(this->super_Texture2DSpecCase).m_texFormat;
    level = 0;
    do {
      width = (this->super_Texture2DSpecCase).m_width >> ((byte)level & 0x1f);
      height = (this->super_Texture2DSpecCase).m_height >> ((byte)level & 0x1f);
      colorB.m_data[0] = 1.0;
      colorB.m_data[1] = 0.0;
      colorB.m_data[2] = 0.0;
      colorB.m_data[3] = 1.0;
      local_a8[0] = 0.0;
      local_a8[1] = 0.0;
      local_a8[2] = 0.0;
      local_a8[3] = 0.0;
      lVar2 = 0;
      do {
        local_a8[lVar2] =
             (this->super_Texture2DSpecCase).m_texFormatInfo.valueMax.m_data[lVar2] -
             (this->super_Texture2DSpecCase).m_texFormatInfo.valueMin.m_data[lVar2];
        lVar2 = lVar2 + 1;
      } while (lVar2 != 4);
      if ((int)width < 2) {
        width = 1;
      }
      res_1.m_data[0] = 0.0;
      res_1.m_data[1] = 0.0;
      res_1.m_data[2] = 0.0;
      res_1.m_data[3] = 0.0;
      lVar2 = 0;
      do {
        res_1.m_data[lVar2] = colorB.m_data[lVar2] * local_a8[lVar2];
        lVar2 = lVar2 + 1;
      } while (lVar2 != 4);
      colorA.m_data[0] = 0.0;
      colorA.m_data[1] = 0.0;
      colorA.m_data[2] = 0.0;
      colorA.m_data[3] = 0.0;
      lVar2 = 0;
      do {
        colorA.m_data[lVar2] =
             res_1.m_data[lVar2] +
             (this->super_Texture2DSpecCase).m_texFormatInfo.valueMin.m_data[lVar2];
        lVar2 = lVar2 + 1;
      } while (lVar2 != 4);
      local_a8[0] = 0.0;
      local_a8[1] = 1.0;
      local_a8[2] = 0.0;
      local_a8[3] = 1.0;
      local_78[0] = 0.0;
      local_78[1] = 0.0;
      local_78[2] = 0.0;
      local_78[3] = 0.0;
      lVar2 = 0;
      do {
        local_78[lVar2] =
             (this->super_Texture2DSpecCase).m_texFormatInfo.valueMax.m_data[lVar2] -
             (this->super_Texture2DSpecCase).m_texFormatInfo.valueMin.m_data[lVar2];
        lVar2 = lVar2 + 1;
      } while (lVar2 != 4);
      res_1.m_data[0] = 0.0;
      res_1.m_data[1] = 0.0;
      res_1.m_data[2] = 0.0;
      res_1.m_data[3] = 0.0;
      lVar2 = 0;
      do {
        res_1.m_data[lVar2] = local_a8[lVar2] * local_78[lVar2];
        lVar2 = lVar2 + 1;
      } while (lVar2 != 4);
      colorB.m_data[0] = 0.0;
      colorB.m_data[1] = 0.0;
      colorB.m_data[2] = 0.0;
      colorB.m_data[3] = 0.0;
      lVar2 = 0;
      do {
        colorB.m_data[lVar2] =
             res_1.m_data[lVar2] +
             (this->super_Texture2DSpecCase).m_texFormatInfo.valueMin.m_data[lVar2];
        lVar2 = lVar2 + 1;
      } while (lVar2 != 4);
      if ((int)height < 2) {
        height = 1;
      }
      iVar1 = tcu::TextureFormat::getPixelSize(this_01);
      rowPitch = -this->m_alignment & (iVar1 * width + this->m_alignment) - 1;
      cellSize = height >> 2;
      if (width >> 2 < height >> 2) {
        cellSize = width >> 2;
      }
      if (cellSize < 2) {
        cellSize = 1;
      }
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                (&data,(long)(int)(rowPitch * height));
      tcu::PixelBufferAccess::PixelBufferAccess
                ((PixelBufferAccess *)&res_1,this_01,width,height,1,rowPitch,0,
                 data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start);
      tcu::fillWithGrid((PixelBufferAccess *)&res_1,cellSize,&colorA,&colorB);
      sglr::ContextWrapper::glTexImage2D
                (this_00,0xde1,level,*(int *)&(this->super_Texture2DSpecCase).field_0xd4,width,
                 height,0,this->m_format,this->m_dataType,
                 data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start);
      level = level + 1;
    } while (level < (this->super_Texture2DSpecCase).m_numLevels);
  }
  if (data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void createTexture (void)
	{
		deUint32			tex			= 0;
		vector<deUint8>		data;

		glGenTextures(1, &tex);
		glBindTexture(GL_TEXTURE_2D, tex);
		glPixelStorei(GL_UNPACK_ALIGNMENT, m_alignment);

		for (int ndx = 0; ndx < m_numLevels; ndx++)
		{
			int		levelW		= de::max(1, m_width >> ndx);
			int		levelH		= de::max(1, m_height >> ndx);
			Vec4	colorA		= Vec4(1.0f, 0.0f, 0.0f, 1.0f)*(m_texFormatInfo.valueMax-m_texFormatInfo.valueMin) + m_texFormatInfo.valueMin;
			Vec4	colorB		= Vec4(0.0f, 1.0f, 0.0f, 1.0f)*(m_texFormatInfo.valueMax-m_texFormatInfo.valueMin) + m_texFormatInfo.valueMin;
			int		rowPitch	= deAlign32(levelW*m_texFormat.getPixelSize(), m_alignment);
			int		cellSize	= de::max(1, de::min(levelW >> 2, levelH >> 2));

			data.resize(rowPitch*levelH);
			tcu::fillWithGrid(tcu::PixelBufferAccess(m_texFormat, levelW, levelH, 1, rowPitch, 0, &data[0]), cellSize, colorA, colorB);

			glTexImage2D(GL_TEXTURE_2D, ndx, m_internalFormat, levelW, levelH, 0, m_format, m_dataType, &data[0]);
		}
	}